

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-vm.c
# Opt level: O2

_Bool callValue(Value callee,int argCount)

{
  ObjType OVar1;
  ulong uVar2;
  _Bool _Var3;
  ObjInstance *pOVar4;
  Value VVar5;
  ObjBoundMethod *bound;
  ObjClosure *closure;
  Value initializer;
  ulong local_30;
  
  if (0x3ffe < (uint)(callee >> 0x32)) {
    closure = (ObjClosure *)(callee & 0x3ffffffffffff);
    OVar1 = (closure->obj).type;
    if (OVar1 < OBJ_STRING) {
      uVar2 = (ulong)(uint)argCount;
      switch(OVar1) {
      case OBJ_BOUND_METHOD:
        vm.stackTop[~argCount] = (Value)closure->function;
        closure = (ObjClosure *)closure->upvalues;
        break;
      case OBJ_CLASS:
        pOVar4 = newInstance((ObjClass *)closure);
        vm.stackTop[~argCount] = (ulong)pOVar4 | 0xfffc000000000000;
        _Var3 = tableGet((Table *)&closure->upvalues,vm.initString,&local_30);
        if (_Var3) {
          _Var3 = call((ObjClosure *)(local_30 & 0x3ffffffffffff),argCount);
          return _Var3;
        }
        if (argCount == 0) {
          return true;
        }
        runtimeError("Expected 0 arguments but got %d.",uVar2);
        return false;
      case OBJ_CLOSURE:
        break;
      default:
        goto switchD_0010305d_caseD_3;
      case OBJ_NATIVE:
        VVar5 = (*(code *)closure->function)(uVar2,vm.stackTop + -uVar2);
        (vm.stackTop + -uVar2)[-1] = VVar5;
        vm.stackTop = vm.stackTop + -uVar2;
        return true;
      }
      _Var3 = call(closure,argCount);
      return _Var3;
    }
  }
switchD_0010305d_caseD_3:
  runtimeError("Can only call functions and classes.");
  return false;
}

Assistant:

static bool callValue(Value callee, int argCount) {
    if (IS_OBJ(callee)) {
        switch (OBJ_TYPE(callee)) {
            case OBJ_BOUND_METHOD: {
                ObjBoundMethod* bound = AS_BOUND_METHOD(callee);
                vm.stackTop[-argCount - 1] = bound->receiver;
                return call(bound->method, argCount);
            }
            case OBJ_CLASS: {
                ObjClass* classObj = AS_CLASS(callee);
                vm.stackTop[-argCount - 1] = OBJ_VAL(newInstance(classObj));
                Value initializer;
                if (tableGet(&classObj->methods, vm.initString, &initializer)) {
                    return call(AS_CLOSURE(initializer), argCount);
                }else if (argCount != 0) {
                    runtimeError("Expected 0 arguments but got %d.", argCount);
                    return false;
                }
                return true;
            }
            case OBJ_CLOSURE:{
                return call(AS_CLOSURE(callee),argCount);
            }
            case OBJ_NATIVE: {
                NativeFn native = AS_NATIVE(callee);
                Value result = native(argCount, vm.stackTop - argCount);
                vm.stackTop -= argCount + 1;
                push(result);
                return true;
            }
            default:
                // Non-callable object type.
                break;
        }
    }

    runtimeError("Can only call functions and classes.");
    return false;
}